

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.hpp
# Opt level: O2

fvar<double,_2UL> * __thiscall
ising::free_energy::triangular::anon_unknown_4::
functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::operator()
          (fvar<double,_2UL> *__return_storage_ptr__,
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
          *this,double t1,double t2)

{
  fvar<double,_2UL> *cr;
  fvar<double,_2UL> retval_2;
  fvar<double,_2UL> retval_1;
  fvar<double,_2UL> retval;
  double local_100;
  double local_f8;
  double local_f0;
  fvar<double,_2UL> local_e8;
  fvar<double,_2UL> local_c8;
  fvar<double,_2UL> local_a8;
  fvar<double,_2UL> local_88;
  fvar<double,_2UL> local_70;
  detail local_58 [24];
  fvar<double,_2UL> local_40;
  
  local_f0 = cos(t1);
  local_a8.v._M_elems[0] = (this->sh2a_).v._M_elems[0];
  local_a8.v._M_elems[1] = (this->sh2a_).v._M_elems[1];
  local_a8.v._M_elems[2] = (this->sh2a_).v._M_elems[2];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            (&local_a8,&local_f0);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
            (&this->cshabc_,&local_a8);
  local_f8 = cos(t2);
  local_c8.v._M_elems[0] = (this->sh2b_).v._M_elems[0];
  local_c8.v._M_elems[1] = (this->sh2b_).v._M_elems[1];
  local_c8.v._M_elems[2] = (this->sh2b_).v._M_elems[2];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            (&local_c8,&local_f8);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
            (&local_88,&local_c8);
  local_100 = cos(t1 + t2);
  local_e8.v._M_elems[0] = (this->sh2c_).v._M_elems[0];
  local_e8.v._M_elems[1] = (this->sh2c_).v._M_elems[1];
  local_e8.v._M_elems[2] = (this->sh2c_).v._M_elems[2];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            (&local_e8,&local_100);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
            (&local_70,&local_e8);
  boost::math::differentiation::autodiff_v1::detail::log<double,2ul>(&local_40,local_58,cr);
  (__return_storage_ptr__->v)._M_elems[2] = local_40.v._M_elems[2];
  (__return_storage_ptr__->v)._M_elems[0] = local_40.v._M_elems[0];
  (__return_storage_ptr__->v)._M_elems[1] = local_40.v._M_elems[1];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            (__return_storage_ptr__,&this->c_);
  return __return_storage_ptr__;
}

Assistant:

FVAR operator()(T t1, T t2) const {
    using std::cos;
    using std::log;
    return c_ * log(cshabc_ - sh2a_ * cos(t1) - sh2b_ * cos(t2) -
                    sh2c_ * cos(t1 + t2));
  }